

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O0

void Rml::PluginRegistry::NotifyShutdown(void)

{
  Plugin *plugin_00;
  bool bVar1;
  PluginVectors *pPVar2;
  reference ppPVar3;
  Plugin *plugin;
  
  while( true ) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    bVar1 = ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::empty(&pPVar2->basic);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    ppPVar3 = ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::back(&pPVar2->basic);
    plugin_00 = *ppPVar3;
    UnregisterPlugin(plugin_00);
    (*plugin_00->_vptr_Plugin[4])();
  }
  ControlledLifetimeResource<Rml::PluginVectors>::Shutdown
            ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  return;
}

Assistant:

void PluginRegistry::NotifyShutdown()
{
	while (!plugin_vectors->basic.empty())
	{
		Plugin* plugin = plugin_vectors->basic.back();
		PluginRegistry::UnregisterPlugin(plugin);
		plugin->OnShutdown();
	}

	plugin_vectors.Shutdown();
}